

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void init_me_luts(void)

{
  aom_bit_depth_t in_EDX;
  aom_bit_depth_t bit_depth;
  aom_bit_depth_t bit_depth_00;
  
  init_me_luts_bd(sad_per_bit_lut_8,8,in_EDX);
  init_me_luts_bd(sad_per_bit_lut_10,10,bit_depth);
  init_me_luts_bd(sad_per_bit_lut_12,0xc,bit_depth_00);
  return;
}

Assistant:

static void init_me_luts(void) {
  init_me_luts_bd(sad_per_bit_lut_8, QINDEX_RANGE, AOM_BITS_8);
  init_me_luts_bd(sad_per_bit_lut_10, QINDEX_RANGE, AOM_BITS_10);
  init_me_luts_bd(sad_per_bit_lut_12, QINDEX_RANGE, AOM_BITS_12);
}